

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip.hpp
# Opt level: O0

void toml::detail::skip_key_value_pair<toml::type_config>
               (location *loc,context<toml::type_config> *ctx)

{
  bool bVar1;
  char_type_conflict cVar2;
  location *in_RSI;
  size_t in_RDI;
  location *unaff_retaddr;
  context<toml::type_config> *in_stack_00000058;
  location *in_stack_00000060;
  context<toml::type_config> *in_stack_00000088;
  location *in_stack_00000090;
  location *in_stack_ffffffffffffffe8;
  
  while( true ) {
    bVar1 = location::eof(in_RSI);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    cVar2 = location::current(in_stack_ffffffffffffffe8);
    if (cVar2 == '=') break;
    cVar2 = location::current(in_stack_ffffffffffffffe8);
    if (cVar2 == '\n') {
      return;
    }
    location::advance(unaff_retaddr,in_RDI);
  }
  skip_whitespace<toml::type_config>(in_stack_00000090,in_stack_00000088);
  skip_value<toml::type_config>(in_stack_00000060,in_stack_00000058);
  return;
}

Assistant:

void skip_key_value_pair(location& loc, const context<TC>& ctx)
{
    while( ! loc.eof())
    {
        if(loc.current() == '=')
        {
            skip_whitespace(loc, ctx);
            skip_value(loc, ctx);
            return;
        }
        else if(loc.current() == '\n')
        {
            // newline is found before finding `=`. assuming "missing `=`".
            return;
        }
        loc.advance();
    }
    return ;
}